

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc_sse2.c
# Opt level: O0

void PredictorSub12_SSE2(uint32_t *in,uint32_t *upper,int num_pixels,uint32_t *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 *puVar5;
  long in_RCX;
  int in_EDX;
  long in_RSI;
  long in_RDI;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  __m128i res;
  __m128i pred;
  __m128i pred_hi;
  __m128i pred_lo;
  __m128i diff_hi;
  __m128i diff_lo;
  __m128i TL_hi;
  __m128i TL_lo;
  __m128i TL;
  __m128i T_hi;
  __m128i T_lo;
  __m128i T;
  __m128i L_hi;
  __m128i L_lo;
  __m128i L;
  __m128i src;
  __m128i zero;
  int i;
  int local_1fc;
  char local_1a8;
  char cStack_1a7;
  char cStack_1a6;
  char cStack_1a5;
  char cStack_1a4;
  char cStack_1a3;
  char cStack_1a2;
  char cStack_1a1;
  char cStack_1a0;
  char cStack_19f;
  char cStack_19e;
  char cStack_19d;
  char cStack_19c;
  char cStack_19b;
  char cStack_19a;
  char cStack_199;
  byte local_158;
  byte bStack_157;
  byte bStack_156;
  byte bStack_155;
  byte bStack_154;
  byte bStack_153;
  byte bStack_152;
  byte bStack_151;
  byte local_138;
  byte bStack_137;
  byte bStack_136;
  byte bStack_135;
  byte bStack_134;
  byte bStack_133;
  byte bStack_132;
  byte bStack_131;
  byte local_118;
  byte bStack_117;
  byte bStack_116;
  byte bStack_115;
  byte bStack_114;
  byte bStack_113;
  byte bStack_112;
  byte bStack_111;
  byte bStack_f0;
  byte bStack_ef;
  byte bStack_ee;
  byte bStack_ed;
  byte bStack_ec;
  byte bStack_eb;
  byte bStack_ea;
  byte bStack_e9;
  byte bStack_d0;
  byte bStack_cf;
  byte bStack_ce;
  byte bStack_cd;
  byte bStack_cc;
  byte bStack_cb;
  byte bStack_ca;
  byte bStack_c9;
  byte bStack_b0;
  byte bStack_af;
  byte bStack_ae;
  byte bStack_ad;
  byte bStack_ac;
  byte bStack_ab;
  byte bStack_aa;
  byte bStack_a9;
  ushort uStack_a6;
  ushort uStack_a4;
  ushort uStack_a2;
  ushort uStack_9e;
  ushort uStack_9c;
  ushort uStack_9a;
  ushort uStack_96;
  ushort uStack_94;
  ushort uStack_92;
  ushort uStack_8e;
  ushort uStack_8c;
  ushort uStack_8a;
  ushort uStack_86;
  ushort uStack_84;
  ushort uStack_82;
  ushort uStack_7e;
  ushort uStack_7c;
  ushort uStack_7a;
  ushort uStack_76;
  ushort uStack_74;
  ushort uStack_72;
  ushort uStack_6e;
  ushort uStack_6c;
  ushort uStack_6a;
  ushort uStack_56;
  ushort uStack_54;
  ushort uStack_52;
  ushort uStack_4e;
  ushort uStack_4c;
  ushort uStack_4a;
  ushort uStack_36;
  ushort uStack_34;
  ushort uStack_32;
  ushort uStack_2e;
  ushort uStack_2c;
  ushort uStack_2a;
  
  for (local_1fc = 0; local_1fc + 4 <= in_EDX; local_1fc = local_1fc + 4) {
    puVar5 = (undefined8 *)(in_RDI + (long)local_1fc * 4);
    uVar1 = *puVar5;
    uVar2 = puVar5[1];
    puVar5 = (undefined8 *)(in_RDI + (long)(local_1fc + -1) * 4);
    uVar3 = *puVar5;
    uVar4 = puVar5[1];
    local_118 = (byte)uVar3;
    bStack_117 = (byte)((ulong)uVar3 >> 8);
    bStack_116 = (byte)((ulong)uVar3 >> 0x10);
    bStack_115 = (byte)((ulong)uVar3 >> 0x18);
    bStack_114 = (byte)((ulong)uVar3 >> 0x20);
    bStack_113 = (byte)((ulong)uVar3 >> 0x28);
    bStack_112 = (byte)((ulong)uVar3 >> 0x30);
    bStack_111 = (byte)((ulong)uVar3 >> 0x38);
    bStack_b0 = (byte)uVar4;
    bStack_af = (byte)((ulong)uVar4 >> 8);
    bStack_ae = (byte)((ulong)uVar4 >> 0x10);
    bStack_ad = (byte)((ulong)uVar4 >> 0x18);
    bStack_ac = (byte)((ulong)uVar4 >> 0x20);
    bStack_ab = (byte)((ulong)uVar4 >> 0x28);
    bStack_aa = (byte)((ulong)uVar4 >> 0x30);
    bStack_a9 = (byte)((ulong)uVar4 >> 0x38);
    puVar5 = (undefined8 *)(in_RSI + (long)local_1fc * 4);
    uVar3 = *puVar5;
    uVar4 = puVar5[1];
    local_138 = (byte)uVar3;
    bStack_137 = (byte)((ulong)uVar3 >> 8);
    bStack_136 = (byte)((ulong)uVar3 >> 0x10);
    bStack_135 = (byte)((ulong)uVar3 >> 0x18);
    bStack_134 = (byte)((ulong)uVar3 >> 0x20);
    bStack_133 = (byte)((ulong)uVar3 >> 0x28);
    bStack_132 = (byte)((ulong)uVar3 >> 0x30);
    bStack_131 = (byte)((ulong)uVar3 >> 0x38);
    bStack_d0 = (byte)uVar4;
    bStack_cf = (byte)((ulong)uVar4 >> 8);
    bStack_ce = (byte)((ulong)uVar4 >> 0x10);
    bStack_cd = (byte)((ulong)uVar4 >> 0x18);
    bStack_cc = (byte)((ulong)uVar4 >> 0x20);
    bStack_cb = (byte)((ulong)uVar4 >> 0x28);
    bStack_ca = (byte)((ulong)uVar4 >> 0x30);
    bStack_c9 = (byte)((ulong)uVar4 >> 0x38);
    puVar5 = (undefined8 *)(in_RSI + (long)(local_1fc + -1) * 4);
    uVar3 = *puVar5;
    uVar4 = puVar5[1];
    local_158 = (byte)uVar3;
    bStack_157 = (byte)((ulong)uVar3 >> 8);
    bStack_156 = (byte)((ulong)uVar3 >> 0x10);
    bStack_155 = (byte)((ulong)uVar3 >> 0x18);
    bStack_154 = (byte)((ulong)uVar3 >> 0x20);
    bStack_153 = (byte)((ulong)uVar3 >> 0x28);
    bStack_152 = (byte)((ulong)uVar3 >> 0x30);
    bStack_151 = (byte)((ulong)uVar3 >> 0x38);
    bStack_f0 = (byte)uVar4;
    bStack_ef = (byte)((ulong)uVar4 >> 8);
    bStack_ee = (byte)((ulong)uVar4 >> 0x10);
    bStack_ed = (byte)((ulong)uVar4 >> 0x18);
    bStack_ec = (byte)((ulong)uVar4 >> 0x20);
    bStack_eb = (byte)((ulong)uVar4 >> 0x28);
    bStack_ea = (byte)((ulong)uVar4 >> 0x30);
    bStack_e9 = (byte)((ulong)uVar4 >> 0x38);
    uStack_76 = (ushort)bStack_137;
    uStack_74 = (ushort)bStack_136;
    uStack_72 = (ushort)bStack_135;
    uStack_6e = (ushort)bStack_133;
    uStack_6c = (ushort)bStack_132;
    uStack_6a = (ushort)bStack_131;
    uStack_86 = (ushort)bStack_157;
    uStack_84 = (ushort)bStack_156;
    uStack_82 = (ushort)bStack_155;
    uStack_7e = (ushort)bStack_153;
    uStack_7c = (ushort)bStack_152;
    uStack_7a = (ushort)bStack_151;
    uStack_96 = (ushort)bStack_cf;
    uStack_94 = (ushort)bStack_ce;
    uStack_92 = (ushort)bStack_cd;
    uStack_8e = (ushort)bStack_cb;
    uStack_8c = (ushort)bStack_ca;
    uStack_8a = (ushort)bStack_c9;
    uStack_a6 = (ushort)bStack_ef;
    uStack_a4 = (ushort)bStack_ee;
    uStack_a2 = (ushort)bStack_ed;
    uStack_9e = (ushort)bStack_eb;
    uStack_9c = (ushort)bStack_ea;
    uStack_9a = (ushort)bStack_e9;
    uStack_36 = (ushort)bStack_117;
    uStack_34 = (ushort)bStack_116;
    uStack_32 = (ushort)bStack_115;
    uStack_2e = (ushort)bStack_113;
    uStack_2c = (ushort)bStack_112;
    uStack_2a = (ushort)bStack_111;
    sVar6 = (ushort)local_118 + ((ushort)local_138 - (ushort)local_158);
    sVar8 = uStack_36 + (uStack_76 - uStack_86);
    sVar10 = uStack_34 + (uStack_74 - uStack_84);
    sVar12 = uStack_32 + (uStack_72 - uStack_82);
    sVar14 = (ushort)bStack_114 + ((ushort)bStack_134 - (ushort)bStack_154);
    sVar16 = uStack_2e + (uStack_6e - uStack_7e);
    sVar18 = uStack_2c + (uStack_6c - uStack_7c);
    sVar20 = uStack_2a + (uStack_6a - uStack_7a);
    uStack_56 = (ushort)bStack_af;
    uStack_54 = (ushort)bStack_ae;
    uStack_52 = (ushort)bStack_ad;
    uStack_4e = (ushort)bStack_ab;
    uStack_4c = (ushort)bStack_aa;
    uStack_4a = (ushort)bStack_a9;
    sVar7 = (ushort)bStack_b0 + ((ushort)bStack_d0 - (ushort)bStack_f0);
    sVar9 = uStack_56 + (uStack_96 - uStack_a6);
    sVar11 = uStack_54 + (uStack_94 - uStack_a4);
    sVar13 = uStack_52 + (uStack_92 - uStack_a2);
    sVar15 = (ushort)bStack_ac + ((ushort)bStack_cc - (ushort)bStack_ec);
    sVar17 = uStack_4e + (uStack_8e - uStack_9e);
    sVar19 = uStack_4c + (uStack_8c - uStack_9c);
    sVar21 = uStack_4a + (uStack_8a - uStack_9a);
    local_1a8 = (char)uVar1;
    cStack_1a7 = (char)((ulong)uVar1 >> 8);
    cStack_1a6 = (char)((ulong)uVar1 >> 0x10);
    cStack_1a5 = (char)((ulong)uVar1 >> 0x18);
    cStack_1a4 = (char)((ulong)uVar1 >> 0x20);
    cStack_1a3 = (char)((ulong)uVar1 >> 0x28);
    cStack_1a2 = (char)((ulong)uVar1 >> 0x30);
    cStack_1a1 = (char)((ulong)uVar1 >> 0x38);
    cStack_1a0 = (char)uVar2;
    cStack_19f = (char)((ulong)uVar2 >> 8);
    cStack_19e = (char)((ulong)uVar2 >> 0x10);
    cStack_19d = (char)((ulong)uVar2 >> 0x18);
    cStack_19c = (char)((ulong)uVar2 >> 0x20);
    cStack_19b = (char)((ulong)uVar2 >> 0x28);
    cStack_19a = (char)((ulong)uVar2 >> 0x30);
    cStack_199 = (char)((ulong)uVar2 >> 0x38);
    puVar5 = (undefined8 *)(in_RCX + (long)local_1fc * 4);
    *puVar5 = CONCAT17(cStack_1a1 -
                       ((0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20)),
                       CONCAT16(cStack_1a2 -
                                ((0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18)),
                                CONCAT15(cStack_1a3 -
                                         ((0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 -
                                         (0xff < sVar16)),
                                         CONCAT14(cStack_1a4 -
                                                  ((0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 -
                                                  (0xff < sVar14)),
                                                  CONCAT13(cStack_1a5 -
                                                           ((0 < sVar12) * (sVar12 < 0x100) *
                                                            (char)sVar12 - (0xff < sVar12)),
                                                           CONCAT12(cStack_1a6 -
                                                                    ((0 < sVar10) * (sVar10 < 0x100)
                                                                     * (char)sVar10 -
                                                                    (0xff < sVar10)),
                                                                    CONCAT11(cStack_1a7 -
                                                                             ((0 < sVar8) *
                                                                              (sVar8 < 0x100) *
                                                                              (char)sVar8 -
                                                                             (0xff < sVar8)),
                                                                             local_1a8 -
                                                                             ((0 < sVar6) *
                                                                              (sVar6 < 0x100) *
                                                                              (char)sVar6 -
                                                                             (0xff < sVar6)))))))));
    puVar5[1] = CONCAT17(cStack_199 -
                         ((0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21)),
                         CONCAT16(cStack_19a -
                                  ((0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19))
                                  ,CONCAT15(cStack_19b -
                                            ((0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 -
                                            (0xff < sVar17)),
                                            CONCAT14(cStack_19c -
                                                     ((0 < sVar15) * (sVar15 < 0x100) * (char)sVar15
                                                     - (0xff < sVar15)),
                                                     CONCAT13(cStack_19d -
                                                              ((0 < sVar13) * (sVar13 < 0x100) *
                                                               (char)sVar13 - (0xff < sVar13)),
                                                              CONCAT12(cStack_19e -
                                                                       ((0 < sVar11) *
                                                                        (sVar11 < 0x100) *
                                                                        (char)sVar11 -
                                                                       (0xff < sVar11)),
                                                                       CONCAT11(cStack_19f -
                                                                                ((0 < sVar9) *
                                                                                 (sVar9 < 0x100) *
                                                                                 (char)sVar9 -
                                                                                (0xff < sVar9)),
                                                                                cStack_1a0 -
                                                                                ((0 < sVar7) *
                                                                                 (sVar7 < 0x100) *
                                                                                 (char)sVar7 -
                                                                                (0xff < sVar7)))))))
                                 ));
  }
  if (local_1fc != in_EDX) {
    (*VP8LPredictorsSub_C[0xc])
              ((uint32_t *)(in_RDI + (long)local_1fc * 4),(uint32_t *)(in_RSI + (long)local_1fc * 4)
               ,in_EDX - local_1fc,(uint32_t *)(in_RCX + (long)local_1fc * 4));
  }
  return;
}

Assistant:

static void PredictorSub12_SSE2(const uint32_t* in, const uint32_t* upper,
                                int num_pixels, uint32_t* out) {
  int i;
  const __m128i zero = _mm_setzero_si128();
  for (i = 0; i + 4 <= num_pixels; i += 4) {
    const __m128i src = _mm_loadu_si128((const __m128i*)&in[i]);
    const __m128i L = _mm_loadu_si128((const __m128i*)&in[i - 1]);
    const __m128i L_lo = _mm_unpacklo_epi8(L, zero);
    const __m128i L_hi = _mm_unpackhi_epi8(L, zero);
    const __m128i T = _mm_loadu_si128((const __m128i*)&upper[i]);
    const __m128i T_lo = _mm_unpacklo_epi8(T, zero);
    const __m128i T_hi = _mm_unpackhi_epi8(T, zero);
    const __m128i TL = _mm_loadu_si128((const __m128i*)&upper[i - 1]);
    const __m128i TL_lo = _mm_unpacklo_epi8(TL, zero);
    const __m128i TL_hi = _mm_unpackhi_epi8(TL, zero);
    const __m128i diff_lo = _mm_sub_epi16(T_lo, TL_lo);
    const __m128i diff_hi = _mm_sub_epi16(T_hi, TL_hi);
    const __m128i pred_lo = _mm_add_epi16(L_lo, diff_lo);
    const __m128i pred_hi = _mm_add_epi16(L_hi, diff_hi);
    const __m128i pred = _mm_packus_epi16(pred_lo, pred_hi);
    const __m128i res = _mm_sub_epi8(src, pred);
    _mm_storeu_si128((__m128i*)&out[i], res);
  }
  if (i != num_pixels) {
    VP8LPredictorsSub_C[12](in + i, upper + i, num_pixels - i, out + i);
  }
}